

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

xmlAutomataPtr xmlNewAutomata(void)

{
  int iVar1;
  xmlRegParserCtxtPtr ctxt;
  xmlRegStatePtr state;
  
  ctxt = xmlRegNewParserCtxt((xmlChar *)0x0);
  if (ctxt != (xmlRegParserCtxtPtr)0x0) {
    ctxt->end = (xmlRegStatePtr)0x0;
    state = xmlRegNewState(ctxt);
    ctxt->state = state;
    ctxt->start = state;
    if (state != (xmlRegStatePtr)0x0) {
      state->type = XML_REGEXP_START_STATE;
      iVar1 = xmlRegStatePush(ctxt,state);
      if (-1 < iVar1) {
        ctxt->flags = 0;
        return ctxt;
      }
      xmlRegFreeState(ctxt->start);
    }
    xmlRegFreeParserCtxt(ctxt);
  }
  return (xmlAutomataPtr)0x0;
}

Assistant:

xmlAutomataPtr
xmlNewAutomata(void) {
    xmlAutomataPtr ctxt;

    ctxt = xmlRegNewParserCtxt(NULL);
    if (ctxt == NULL)
	return(NULL);

    /* initialize the parser */
    ctxt->end = NULL;
    ctxt->start = ctxt->state = xmlRegNewState(ctxt);
    if (ctxt->start == NULL) {
	xmlFreeAutomata(ctxt);
	return(NULL);
    }
    ctxt->start->type = XML_REGEXP_START_STATE;
    if (xmlRegStatePush(ctxt, ctxt->start) < 0) {
        xmlRegFreeState(ctxt->start);
	xmlFreeAutomata(ctxt);
	return(NULL);
    }
    ctxt->flags = 0;

    return(ctxt);
}